

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

void __thiscall minibag::StreamFactory::StreamFactory(StreamFactory *this,ChunkedFile *file)

{
  element_type *this_00;
  BZ2Stream *this_01;
  LZ4Stream *this_02;
  
  this_00 = (element_type *)operator_new(0x10);
  UncompressedStream::UncompressedStream((UncompressedStream *)this_00,file);
  (this->uncompressed_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<minibag::UncompressedStream*>
            (&(this->uncompressed_stream_).
              super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (UncompressedStream *)this_00);
  (this->lz4_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lz4_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bz2_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->bz2_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (BZ2Stream *)operator_new(0x30);
  BZ2Stream::BZ2Stream(this_01,file);
  std::__shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>::reset<minibag::BZ2Stream>
            (&(this->bz2_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>,
             this_01);
  this_02 = (LZ4Stream *)operator_new(0x50);
  LZ4Stream::LZ4Stream(this_02,file);
  std::__shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>::reset<minibag::LZ4Stream>
            (&(this->lz4_stream_).super___shared_ptr<minibag::Stream,_(__gnu_cxx::_Lock_policy)2>,
             this_02);
  return;
}

Assistant:

StreamFactory::StreamFactory(ChunkedFile* file) :
    uncompressed_stream_(new UncompressedStream(file))
{
#ifdef MINIBAG_HAS_BZIP2
	bz2_stream_.reset(new BZ2Stream(file));
#endif

#ifdef MINIBAG_HAS_LZ4
	lz4_stream_.reset(new LZ4Stream(file));
#endif
}